

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

Sexp * ReadSublist(istream *input)

{
  int iVar1;
  Sexp *pSVar2;
  Sexp *local_30;
  Sexp *cdr;
  FrameProtector __frame_prot;
  Sexp *car;
  
  FrameProtector::FrameProtector((FrameProtector *)&cdr,"ReadSublist");
  __frame_prot.protected_frame = (Frame *)0x0;
  FrameProtector::ProtectValue((FrameProtector *)&cdr,(Sexp **)&__frame_prot,"car");
  local_30 = (Sexp *)0x0;
  FrameProtector::ProtectValue((FrameProtector *)&cdr,&local_30,"cdr");
  iVar1 = std::istream::peek();
  if (iVar1 == *(char *)((long)&list_delimiter_stack_index + list_delimiter_stack_index + 7)) {
    pSVar2 = &g_the_empty_sexp;
  }
  else {
    SkipWhitespace(input);
    __frame_prot.protected_frame = (Frame *)ReadAtom(input);
    SkipWhitespace(input);
    iVar1 = std::istream::peek();
    if (iVar1 == *(char *)((long)&list_delimiter_stack_index + list_delimiter_stack_index + 7)) {
      pSVar2 = GcHeap::AllocateCons((Sexp *)__frame_prot.protected_frame,&g_the_empty_sexp);
    }
    else {
      iVar1 = std::istream::peek();
      if (iVar1 == 0x2e) {
        Expect(input,'.');
        local_30 = ReadAtom(input);
      }
      else {
        local_30 = ReadSublist(input);
      }
      pSVar2 = GcHeap::AllocateCons((Sexp *)__frame_prot.protected_frame,local_30);
    }
  }
  FrameProtector::~FrameProtector((FrameProtector *)&cdr);
  return pSVar2;
}

Assistant:

static Sexp *ReadSublist(std::istream &input) {
  // at this point, we are reading a list and we've already read
  // the opening paren.
  //   (call 1 2 3)
  //    ^--- we are here
  GC_HELPER_FRAME;
  GC_PROTECTED_LOCAL(car);
  GC_PROTECTED_LOCAL(cdr);

  if (IsAtListEnd(input)) {
    return GcHeap::AllocateEmpty();
  }

  SkipWhitespace(input);
  car = ReadAtom(input);
  SkipWhitespace(input);
  if (!IsAtListEnd(input)) {
    if (Peek(input) == '.') {
      // this is an improper list.
      Expect(input, '.');
      cdr = ReadAtom(input);
      return GcHeap::AllocateCons(car, cdr);
    }

    cdr = ReadSublist(input);
    return GcHeap::AllocateCons(car, cdr);
  }

  return GcHeap::AllocateCons(car, GcHeap::AllocateEmpty());
}